

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

int CGL::Collada::ColladaParser::load(char *filename,SceneInfo *sceneInfo)

{
  char cVar1;
  bool bVar2;
  XMLElement *pXVar3;
  XMLElement *pXVar4;
  char *pcVar5;
  double *pdVar6;
  int iVar7;
  string up_dir;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  allocator local_528 [128];
  XMLDocument doc;
  ifstream in;
  
  std::ifstream::ifstream(&in,filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    iVar7 = -1;
LAB_00111ec4:
    std::ifstream::~ifstream(&in);
    return iVar7;
  }
  std::ifstream::close();
  tinyxml2::XMLDocument::XMLDocument(&doc,true,PRESERVE_WHITESPACE);
  tinyxml2::XMLDocument::LoadFile(&doc,filename);
  if (doc._errorID == XML_NO_ERROR) {
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&doc.super_XMLNode,"COLLADA");
    if (pXVar3 != (XMLElement *)0x0) {
      scene = sceneInfo;
      uri_load(pXVar3);
      std::__cxx11::string::string((string *)&local_548,"asset",local_528);
      pXVar4 = get_element(pXVar3,&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      if (pXVar4 != (XMLElement *)0x0) {
        std::__cxx11::string::string((string *)&local_568,"up_axis",local_528);
        pXVar4 = get_element(pXVar4,&local_568);
        std::__cxx11::string::~string((string *)&local_568);
        if (pXVar4 == (XMLElement *)0x0) goto LAB_00111eee;
        pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
        std::__cxx11::string::string((string *)&up_dir,pcVar5,local_528);
        Matrix4x4::identity();
        transform[0x60] = local_528[0x60];
        transform[0x61] = local_528[0x61];
        transform[0x62] = local_528[0x62];
        transform[99] = local_528[99];
        transform[100] = local_528[100];
        transform[0x65] = local_528[0x65];
        transform[0x66] = local_528[0x66];
        transform[0x67] = local_528[0x67];
        transform[0x68] = local_528[0x68];
        transform[0x69] = local_528[0x69];
        transform[0x6a] = local_528[0x6a];
        transform[0x6b] = local_528[0x6b];
        transform[0x6c] = local_528[0x6c];
        transform[0x6d] = local_528[0x6d];
        transform[0x6e] = local_528[0x6e];
        transform[0x6f] = local_528[0x6f];
        transform[0x70] = local_528[0x70];
        transform[0x71] = local_528[0x71];
        transform[0x72] = local_528[0x72];
        transform[0x73] = local_528[0x73];
        transform[0x74] = local_528[0x74];
        transform[0x75] = local_528[0x75];
        transform[0x76] = local_528[0x76];
        transform[0x77] = local_528[0x77];
        transform[0x78] = local_528[0x78];
        transform[0x79] = local_528[0x79];
        transform[0x7a] = local_528[0x7a];
        transform[0x7b] = local_528[0x7b];
        transform[0x7c] = local_528[0x7c];
        transform[0x7d] = local_528[0x7d];
        transform[0x7e] = local_528[0x7e];
        transform[0x7f] = local_528[0x7f];
        transform[0x40] = local_528[0x40];
        transform[0x41] = local_528[0x41];
        transform[0x42] = local_528[0x42];
        transform[0x43] = local_528[0x43];
        transform[0x44] = local_528[0x44];
        transform[0x45] = local_528[0x45];
        transform[0x46] = local_528[0x46];
        transform[0x47] = local_528[0x47];
        transform[0x48] = local_528[0x48];
        transform[0x49] = local_528[0x49];
        transform[0x4a] = local_528[0x4a];
        transform[0x4b] = local_528[0x4b];
        transform[0x4c] = local_528[0x4c];
        transform[0x4d] = local_528[0x4d];
        transform[0x4e] = local_528[0x4e];
        transform[0x4f] = local_528[0x4f];
        transform[0x50] = local_528[0x50];
        transform[0x51] = local_528[0x51];
        transform[0x52] = local_528[0x52];
        transform[0x53] = local_528[0x53];
        transform[0x54] = local_528[0x54];
        transform[0x55] = local_528[0x55];
        transform[0x56] = local_528[0x56];
        transform[0x57] = local_528[0x57];
        transform[0x58] = local_528[0x58];
        transform[0x59] = local_528[0x59];
        transform[0x5a] = local_528[0x5a];
        transform[0x5b] = local_528[0x5b];
        transform[0x5c] = local_528[0x5c];
        transform[0x5d] = local_528[0x5d];
        transform[0x5e] = local_528[0x5e];
        transform[0x5f] = local_528[0x5f];
        transform[0x20] = local_528[0x20];
        transform[0x21] = local_528[0x21];
        transform[0x22] = local_528[0x22];
        transform[0x23] = local_528[0x23];
        transform[0x24] = local_528[0x24];
        transform[0x25] = local_528[0x25];
        transform[0x26] = local_528[0x26];
        transform[0x27] = local_528[0x27];
        transform[0x28] = local_528[0x28];
        transform[0x29] = local_528[0x29];
        transform[0x2a] = local_528[0x2a];
        transform[0x2b] = local_528[0x2b];
        transform[0x2c] = local_528[0x2c];
        transform[0x2d] = local_528[0x2d];
        transform[0x2e] = local_528[0x2e];
        transform[0x2f] = local_528[0x2f];
        transform[0x30] = local_528[0x30];
        transform[0x31] = local_528[0x31];
        transform[0x32] = local_528[0x32];
        transform[0x33] = local_528[0x33];
        transform[0x34] = local_528[0x34];
        transform[0x35] = local_528[0x35];
        transform[0x36] = local_528[0x36];
        transform[0x37] = local_528[0x37];
        transform[0x38] = local_528[0x38];
        transform[0x39] = local_528[0x39];
        transform[0x3a] = local_528[0x3a];
        transform[0x3b] = local_528[0x3b];
        transform[0x3c] = local_528[0x3c];
        transform[0x3d] = local_528[0x3d];
        transform[0x3e] = local_528[0x3e];
        transform[0x3f] = local_528[0x3f];
        transform[0] = local_528[0];
        transform[1] = local_528[1];
        transform[2] = local_528[2];
        transform[3] = local_528[3];
        transform[4] = local_528[4];
        transform[5] = local_528[5];
        transform[6] = local_528[6];
        transform[7] = local_528[7];
        transform[8] = local_528[8];
        transform[9] = local_528[9];
        transform[10] = local_528[10];
        transform[0xb] = local_528[0xb];
        transform[0xc] = local_528[0xc];
        transform[0xd] = local_528[0xd];
        transform[0xe] = local_528[0xe];
        transform[0xf] = local_528[0xf];
        transform[0x10] = local_528[0x10];
        transform[0x11] = local_528[0x11];
        transform[0x12] = local_528[0x12];
        transform[0x13] = local_528[0x13];
        transform[0x14] = local_528[0x14];
        transform[0x15] = local_528[0x15];
        transform[0x16] = local_528[0x16];
        transform[0x17] = local_528[0x17];
        transform[0x18] = local_528[0x18];
        transform[0x19] = local_528[0x19];
        transform[0x1a] = local_528[0x1a];
        transform[0x1b] = local_528[0x1b];
        transform[0x1c] = local_528[0x1c];
        transform[0x1d] = local_528[0x1d];
        transform[0x1e] = local_528[0x1e];
        transform[0x1f] = local_528[0x1f];
        bVar2 = std::operator==(&up_dir,"X_UP");
        if (bVar2) {
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)transform,0,0);
          *pdVar6 = 0.0;
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)transform,0,1);
          *pdVar6 = 1.0;
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)transform,1,0);
          *pdVar6 = 1.0;
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)transform,1,1);
          *pdVar6 = 0.0;
          pdVar6 = Matrix4x4::operator()((Matrix4x4 *)transform,2,2);
          *pdVar6 = -1.0;
          _up = ZEXT816(0x3ff0000000000000);
          DAT_002a4e50 = 0;
        }
        else {
          bVar2 = std::operator==(&up_dir,"Z_UP");
          if (bVar2) {
            pdVar6 = Matrix4x4::operator()((Matrix4x4 *)transform,1,1);
            *pdVar6 = 0.0;
            pdVar6 = Matrix4x4::operator()((Matrix4x4 *)transform,1,2);
            *pdVar6 = 1.0;
            pdVar6 = Matrix4x4::operator()((Matrix4x4 *)transform,2,1);
            *pdVar6 = 1.0;
            pdVar6 = Matrix4x4::operator()((Matrix4x4 *)transform,2,2);
            *pdVar6 = 0.0;
            pdVar6 = Matrix4x4::operator()((Matrix4x4 *)transform,0,0);
            *pdVar6 = -1.0;
            _up = ZEXT816(0);
            DAT_002a4e50 = 0x3ff0000000000000;
          }
          else {
            bVar2 = std::operator==(&up_dir,"Y_UP");
            if (!bVar2) goto LAB_00111eee;
            _up = vmovhps_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
            DAT_002a4e50 = 0;
          }
        }
        std::__cxx11::string::~string((string *)&up_dir);
      }
      std::__cxx11::string::string((string *)&local_588,"scene/instance_visual_scene",local_528);
      pXVar3 = get_element(pXVar3,&local_588);
      std::__cxx11::string::~string((string *)&local_588);
      if (pXVar3 != (XMLElement *)0x0) {
        std::__cxx11::string::string((string *)&local_5a8,"node",local_528);
        pXVar4 = get_element(pXVar3,&local_5a8);
        std::__cxx11::string::~string((string *)&local_5a8);
        for (; pXVar4 != (XMLElement *)0x0;
            pXVar4 = tinyxml2::XMLNode::NextSiblingElement(&pXVar4->super_XMLNode,"node")) {
          parse_node(pXVar4);
        }
      }
      iVar7 = -(uint)(pXVar3 == (XMLElement *)0x0);
      tinyxml2::XMLDocument::~XMLDocument(&doc);
      goto LAB_00111ec4;
    }
  }
  else {
    tinyxml2::XMLDocument::PrintError(&doc);
  }
LAB_00111eee:
  exit(1);
}

Assistant:

int ColladaParser::load( const char* filename, SceneInfo* sceneInfo ) {

  ifstream in (filename);
  if (!in.is_open()) {
    return -1;
  } in.close();

  XMLDocument doc;
  doc.LoadFile(filename);
  if (doc.Error()) {
    stat("XML error: ");
    doc.PrintError();
    exit(EXIT_FAILURE);
  }

  // Check XML schema
  XMLElement* root = doc.FirstChildElement("COLLADA");
  if (!root) {
    stat("Error: not a COLLADA file!")
    exit(EXIT_FAILURE);
  } else {
    stat("Loading COLLADA file...");
  }

  // Set output scene pointer
  scene = sceneInfo;

  // Build uri table
  uri_load(root);

  // Load assets - correct up direction
  if (XMLElement* e_asset = get_element(root, "asset")) {
    XMLElement* up_axis = get_element(e_asset, "up_axis");
    if (!up_axis) {
      stat("Error: No up direction defined in COLLADA file");
      exit(EXIT_FAILURE);
    }

    // get up direction and correct non-Y_UP scenes by setting a non-identity
    // global entry transformation, assuming right hand coordinate system for
    // both input and output

    string up_dir = up_axis->GetText();
    transform = Matrix4x4::identity();
    if (up_dir == "X_UP") {

      // swap X-Y and negate Z
      transform(0,0) =  0; transform(0,1) = 1;
      transform(1,0) =  1; transform(1,1) = 0;
      transform(2,2) = -1;

      // local up direction for lights and cameras
      up = Vector3D(1,0,0);

    } else if (up_dir == "Z_UP") {

      // swap Z-Y matrix and negate X
      transform(1,1) =  0; transform(1,2) = 1;
      transform(2,1) =  1; transform(2,2) = 0;
      transform(0,0) = -1;

      // local up direction cameras
      up = Vector3D(0,0,1);

    } else if (up_dir == "Y_UP") {
      up = Vector3D(0,1,0); // no need to correct Y_UP as its used internally
    } else {
      stat("Error: invalid up direction in COLLADA file");
      exit(EXIT_FAILURE);
    }
  }

  // Load scene -
  // A scene should only have one visual_scene instance, this constraint
  // creates a one-to-one relationship between the document, the top-level
  // scene, and its visual description (COLLADA spec 1.4 page 91)
  if (XMLElement* e_scene = get_element(root, "scene/instance_visual_scene")) {

    stat("Loading scene...");

    // parse all nodes in scene
    XMLElement* e_node = get_element(e_scene, "node");
    while (e_node) {
      parse_node(e_node);
      e_node = e_node->NextSiblingElement("node");
    }

  } else {
    stat("Error: No scene description found in file:" << filename);
    return -1;
  }

  return 0;

}